

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRF02.h
# Opt level: O0

int SendRangeRequestSRF02(SRF02 *pSRF02,int device)

{
  int iVar1;
  uint8 local_48 [4];
  int sendbuflen;
  uchar sendbuf [32];
  int device_local;
  SRF02 *pSRF02_local;
  
  if ((device < 0) || (0xf < device)) {
    printf("Error reading data from a SRF02 : Invalid parameter. \n");
    pSRF02_local._4_4_ = 3;
  }
  else {
    iVar1 = SetSlaveComputerI2CBus
                      (pSRF02->I2CBus,pSRF02->addr[device],0,0,pSRF02->nbretries,pSRF02->timeout);
    if (iVar1 == 0) {
      memset(local_48,0,0x20);
      local_48[0] = '\0';
      local_48[1] = 0x51;
      iVar1 = WriteAllComputerI2CBus(pSRF02->I2CBus,local_48,2);
      if (iVar1 == 0) {
        if ((pSRF02->bSaveRawData != 0) && (pSRF02->pfSaveFile != (FILE *)0x0)) {
          fwrite(local_48,2,1,(FILE *)pSRF02->pfSaveFile);
          fflush((FILE *)pSRF02->pfSaveFile);
        }
        pSRF02_local._4_4_ = 0;
      }
      else {
        pSRF02_local._4_4_ = 1;
      }
    }
    else {
      pSRF02_local._4_4_ = 1;
    }
  }
  return pSRF02_local._4_4_;
}

Assistant:

inline int SendRangeRequestSRF02(SRF02* pSRF02, int device)
{
	unsigned char sendbuf[MAX_NB_BYTES_SRF02];
	int sendbuflen = 0;

	if ((device < 0)||(device >= MAX_NB_DEVICES_SRF02))
	{
		printf("Error reading data from a SRF02 : Invalid parameter. \n");
		return EXIT_INVALID_PARAMETER;
	}

	if (SetSlaveComputerI2CBus(pSRF02->I2CBus, pSRF02->addr[device], 0, 0, pSRF02->nbretries, pSRF02->timeout) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)COMMAND_REG_SRF02;
	sendbuf[1] = (unsigned char)REAL_RNG_CM_CMD_SRF02;
	sendbuflen = 2;

	if (WriteAllComputerI2CBus(pSRF02->I2CBus, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pSRF02->bSaveRawData)&&(pSRF02->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pSRF02->pfSaveFile);
		fflush(pSRF02->pfSaveFile);
	}

	return EXIT_SUCCESS;
}